

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::date_t,duckdb::date_t>
          (BaseAppender *this,Vector *col,date_t input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,&local_3c,false);
  if (bVar1) {
    *(int32_t *)(col->data + (this->chunk).count * 4) = local_3c.days;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::date_t>
            (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}